

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBase32.cxx
# Opt level: O1

string * __thiscall
cmBase32Encoder::encodeString_abi_cxx11_
          (string *__return_storage_ptr__,cmBase32Encoder *this,uchar *input,size_t len,bool padding
          )

{
  long lVar1;
  undefined3 in_register_00000081;
  long lVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  uchar *__s;
  uchar extended [5];
  char buffer [8];
  uchar local_51 [5];
  undefined4 local_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  char local_40 [8];
  size_t local_38;
  
  local_4c = CONCAT31(in_register_00000081,padding);
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = local_51 + len;
  local_38 = len;
  for (lVar3 = 0; input + lVar3 + 5 <= input + len; lVar3 = lVar3 + 5) {
    Base32Encode5(input + lVar3,local_40);
    __s = __s + -5;
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_40);
  }
  lVar2 = lVar3 - local_38;
  lVar1 = lVar3 - local_38;
  if (lVar1 == 0) {
    return __return_storage_ptr__;
  }
  lVar4 = local_38 - 5;
  memcpy(local_51,input + lVar3,-lVar2);
  if (lVar4 != lVar3) {
    memset(__s,0,lVar1 + 5);
  }
  Base32Encode5(local_51,local_40);
  switch(-lVar2) {
  case 1:
    lVar3 = 6;
    break;
  case 2:
    lVar3 = 4;
    break;
  case 3:
    lVar3 = 3;
    break;
  case 4:
    lVar3 = 1;
    break;
  default:
    bVar5 = 0;
    lVar3 = 0;
    goto LAB_003cef22;
  }
  bVar5 = 1;
LAB_003cef22:
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_40);
  if ((bVar5 & (byte)local_4c) == 1) {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmBase32Encoder::encodeString(const unsigned char* input,
                                          size_t len, bool padding)
{
  std::string res;

  static const size_t blockSize = 5;
  static const size_t bufferSize = 8;
  char buffer[bufferSize];

  const unsigned char* end = input + len;
  while ((input + blockSize) <= end) {
    Base32Encode5(input, buffer);
    res.append(buffer, bufferSize);
    input += blockSize;
  }

  size_t remain = static_cast<size_t>(end - input);
  if (remain != 0) {
    // Temporary source buffer filled up with 0s
    unsigned char extended[blockSize];
    for (size_t ii = 0; ii != remain; ++ii) {
      extended[ii] = input[ii];
    }
    for (size_t ii = remain; ii != blockSize; ++ii) {
      extended[ii] = 0;
    }

    Base32Encode5(extended, buffer);
    size_t numPad(0);
    switch (remain) {
      case 1:
        numPad = 6;
        break;
      case 2:
        numPad = 4;
        break;
      case 3:
        numPad = 3;
        break;
      case 4:
        numPad = 1;
        break;
      default:
        break;
    }
    res.append(buffer, bufferSize - numPad);
    if (padding) {
      for (size_t ii = 0; ii != numPad; ++ii) {
        res.push_back(paddingChar);
      }
    }
  }

  return res;
}